

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code.hpp
# Opt level: O1

bool __thiscall
system_error2::_posix_code_domain::_do_equivalent
          (_posix_code_domain *this,status_code<void> *code1,status_code<void> *code2)

{
  unique_id_type uVar1;
  unique_id_type uVar2;
  bool bVar3;
  
  uVar1 = (this->super_status_code_domain)._id;
  if (code1->_domain->_id != uVar1) {
    __assert_fail("code1.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/posix_code.hpp"
                  ,0x93,
                  "virtual bool system_error2::_posix_code_domain::_do_equivalent(const status_code<void> &, const status_code<void> &) const"
                 );
  }
  uVar2 = code2->_domain->_id;
  if (uVar2 == uVar1) {
    bVar3 = *(int *)&code1[1]._domain == *(int *)&code2[1]._domain;
  }
  else if ((uVar2 != 0x746d6354f4f733e9) ||
          (bVar3 = true, *(int *)&code2[1]._domain != *(int *)&code1[1]._domain)) {
    return false;
  }
  return bVar3;
}

Assistant:

SYSTEM_ERROR2_NODISCARD constexpr bool empty() const noexcept { return _domain == nullptr; }